

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O2

void __thiscall QWidgetWindow::handleFocusInEvent(QWidgetWindow *this,QFocusEvent *e)

{
  int iVar1;
  QWidget *this_00;
  FocusWidgets fw;
  
  iVar1 = QFocusEvent::reason();
  if (iVar1 == 2) {
    fw = LastFocusWidget;
  }
  else {
    iVar1 = QFocusEvent::reason();
    fw = FirstFocusWidget;
    if (iVar1 != 1) {
      return;
    }
  }
  this_00 = getFocusWidget(this,fw);
  if (this_00 == (QWidget *)0x0) {
    return;
  }
  QWidget::setFocus(this_00);
  return;
}

Assistant:

void QWidgetWindow::handleFocusInEvent(QFocusEvent *e)
{
    QWidget *focusWidget = nullptr;
    if (e->reason() == Qt::BacktabFocusReason)
        focusWidget = getFocusWidget(LastFocusWidget);
    else if (e->reason() == Qt::TabFocusReason)
        focusWidget = getFocusWidget(FirstFocusWidget);

    if (focusWidget != nullptr)
        focusWidget->setFocus();
}